

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# libjsonnet.cpp
# Opt level: O1

char * jsonnet_evaluate_snippet_aux
                 (JsonnetVm *vm,char *filename,char *snippet,int *error,EvalKind kind)

{
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_jsonnet::internal::VmExt,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_jsonnet::internal::VmExt>_>_>
  *ext_vars;
  VmNativeCallbackMap *natives;
  _Base_ptr *pp_Var1;
  _Base_ptr p_Var2;
  long lVar3;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *doc;
  _Rb_tree_node_base *p_Var4;
  char *pcVar5;
  undefined8 extraout_RAX;
  StaticError *err;
  long *plVar6;
  ostream *poVar7;
  long lVar8;
  int extraout_EDX;
  ulong uVar9;
  ulong uVar10;
  JsonnetVm *pJVar11;
  size_t sVar12;
  iterator __begin3_1;
  undefined8 *puVar13;
  ulong uVar14;
  _Rb_tree_header *p_Var15;
  uint uVar16;
  iterator __begin3;
  long lVar17;
  allocator<char> local_221;
  AST *expr;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  files;
  Tokens tokens;
  Allocator alloc;
  ios_base local_138 [264];
  
  alloc.internedIdentifiers._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &alloc.internedIdentifiers._M_t._M_impl.super__Rb_tree_header._M_header;
  alloc.internedIdentifiers._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  alloc.internedIdentifiers._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  alloc.internedIdentifiers._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  alloc.allocated.
  super__List_base<jsonnet::internal::AST_*,_std::allocator<jsonnet::internal::AST_*>_>._M_impl.
  _M_node.super__List_node_base._M_next = (_List_node_base *)&alloc.allocated;
  alloc.allocated.
  super__List_base<jsonnet::internal::AST_*,_std::allocator<jsonnet::internal::AST_*>_>._M_impl.
  _M_node._M_size = 0;
  alloc.internedIdentifiers._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       alloc.internedIdentifiers._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  alloc.allocated.
  super__List_base<jsonnet::internal::AST_*,_std::allocator<jsonnet::internal::AST_*>_>._M_impl.
  _M_node.super__List_node_base._M_prev =
       alloc.allocated.
       super__List_base<jsonnet::internal::AST_*,_std::allocator<jsonnet::internal::AST_*>_>._M_impl
       ._M_node.super__List_node_base._M_next;
  std::__cxx11::string::string<std::allocator<char>>((string *)&files,filename,&local_221);
  jsonnet::internal::jsonnet_lex(&tokens,(string *)&files,snippet);
  pp_Var1 = &files._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
  if ((_Base_ptr *)files._M_t._M_impl._0_8_ != pp_Var1) {
    operator_delete((void *)files._M_t._M_impl._0_8_,
                    (ulong)((long)&(files._M_t._M_impl.super__Rb_tree_header._M_header._M_parent)->
                                   _M_color + 1));
  }
  expr = jsonnet::internal::jsonnet_parse(&alloc,&tokens);
  jsonnet::internal::jsonnet_desugar(&alloc,&expr,&vm->tla);
  uVar16 = vm->maxStack;
  jsonnet::internal::jsonnet_static_analysis(expr);
  uVar16 = uVar16 + 2;
  ext_vars = &vm->ext;
  natives = &vm->nativeCallbacks;
  if (kind == REGULAR) {
    jsonnet::internal::jsonnet_vm_execute
              ((string *)&files,&alloc,expr,ext_vars,uVar16,(double)vm->gcMinObjects,
               vm->gcGrowthTrigger,natives,vm->importCallback,vm->importCallbackContext,
               vm->stringOutput);
    pJVar11 = (JsonnetVm *)&files;
    std::__cxx11::string::append((char *)pJVar11);
    *error = 0;
    pcVar5 = jsonnet_realloc(pJVar11,(char *)0x0,
                             files._M_t._M_impl.super__Rb_tree_header._M_header._0_8_ + 1);
    memcpy(pcVar5,(void *)files._M_t._M_impl._0_8_,
           files._M_t._M_impl.super__Rb_tree_header._M_header._0_8_ + 1);
    if ((_Base_ptr *)files._M_t._M_impl._0_8_ != pp_Var1) {
      operator_delete((void *)files._M_t._M_impl._0_8_,
                      (ulong)((long)&(files._M_t._M_impl.super__Rb_tree_header._M_header._M_parent)
                                     ->_M_color + 1));
    }
  }
  else if (kind == MULTI) {
    jsonnet::internal::jsonnet_vm_execute_multi
              (&files,&alloc,expr,ext_vars,uVar16,(double)vm->gcMinObjects,vm->gcGrowthTrigger,
               natives,vm->importCallback,vm->importCallbackContext,vm->stringOutput);
    p_Var15 = &files._M_t._M_impl.super__Rb_tree_header;
    vm = (JsonnetVm *)0x1;
    for (p_Var4 = files._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
        (_Rb_tree_header *)p_Var4 != p_Var15;
        p_Var4 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var4)) {
      vm = (JsonnetVm *)
           ((long)&(p_Var4[2]._M_parent)->_M_color +
           (long)&(p_Var4[1]._M_parent)->_M_color + (long)&vm->gcGrowthTrigger + 3);
    }
    pcVar5 = (char *)malloc((size_t)vm);
    if (pcVar5 == (char *)0x0) {
      jsonnet_evaluate_snippet_aux();
LAB_0014b103:
      jsonnet_evaluate_snippet_aux();
      if ((_Rb_tree_header *)files._M_t._M_impl._0_8_ != p_Var15) {
        operator_delete((void *)files._M_t._M_impl._0_8_,
                        (ulong)((long)&(files._M_t._M_impl.super__Rb_tree_header._M_header._M_parent
                                       )->_M_color + 1));
      }
      std::__cxx11::_List_base<jsonnet::internal::Token,_std::allocator<jsonnet::internal::Token>_>
      ::_M_clear(&tokens.
                  super__List_base<jsonnet::internal::Token,_std::allocator<jsonnet::internal::Token>_>
                );
      jsonnet::internal::Allocator::~Allocator(&alloc);
      if (extraout_EDX == 2) {
        err = (StaticError *)__cxa_begin_catch(extraout_RAX);
        std::__cxx11::stringstream::stringstream((stringstream *)&alloc);
        poVar7 = (ostream *)
                 &alloc.internedIdentifiers._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
        std::__ostream_insert<char,std::char_traits<char>>(poVar7,"STATIC ERROR: ",0xe);
        jsonnet::internal::operator<<(poVar7,err);
        std::endl<char,std::char_traits<char>>(poVar7);
        *error = 1;
        pJVar11 = (JsonnetVm *)&files;
        std::__cxx11::stringbuf::str();
        pcVar5 = jsonnet_realloc(pJVar11,(char *)0x0,
                                 files._M_t._M_impl.super__Rb_tree_header._M_header._0_8_ + 1);
        memcpy(pcVar5,(void *)files._M_t._M_impl._0_8_,
               files._M_t._M_impl.super__Rb_tree_header._M_header._0_8_ + 1);
        if ((_Base_ptr *)files._M_t._M_impl._0_8_ !=
            &files._M_t._M_impl.super__Rb_tree_header._M_header._M_parent) {
          operator_delete((void *)files._M_t._M_impl._0_8_,
                          (ulong)((long)&(files._M_t._M_impl.super__Rb_tree_header._M_header.
                                         _M_parent)->_M_color + 1));
        }
      }
      else {
        if (extraout_EDX != 1) {
          _Unwind_Resume(extraout_RAX);
        }
        plVar6 = (long *)__cxa_begin_catch(extraout_RAX);
        std::__cxx11::stringstream::stringstream((stringstream *)&alloc);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)
                   &alloc.internedIdentifiers._M_t._M_impl.super__Rb_tree_header._M_header._M_parent
                   ,"RUNTIME ERROR: ",0xf);
        poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                           ((ostream *)
                            &alloc.internedIdentifiers._M_t._M_impl.super__Rb_tree_header._M_header.
                             _M_parent,(char *)plVar6[3],plVar6[4]);
        std::endl<char,std::char_traits<char>>(poVar7);
        if (0 < plVar6[1] - *plVar6) {
          uVar10 = (ulong)(vm->maxTrace >> 1);
          uVar9 = (ulong)(plVar6[1] - *plVar6) / 0x60;
          lVar8 = (uVar10 - vm->maxTrace) + uVar9;
          if (uVar9 < 2) {
            uVar9 = 1;
          }
          lVar17 = 0;
          uVar14 = 0;
          do {
            lVar3 = *plVar6;
            if (((vm->maxTrace == 0) || (uVar14 < uVar10)) || (lVar8 <= (long)uVar14)) {
              std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)
                         &alloc.internedIdentifiers._M_t._M_impl.super__Rb_tree_header._M_header.
                          _M_parent,"\t",1);
              jsonnet::internal::operator<<
                        ((ostream *)
                         &alloc.internedIdentifiers._M_t._M_impl.super__Rb_tree_header._M_header.
                          _M_parent,(LocationRange *)(lVar17 + lVar3));
              std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)
                         &alloc.internedIdentifiers._M_t._M_impl.super__Rb_tree_header._M_header.
                          _M_parent,"\t",1);
              poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                                 ((ostream *)
                                  &alloc.internedIdentifiers._M_t._M_impl.super__Rb_tree_header.
                                   _M_header._M_parent,*(char **)(lVar3 + 0x40 + lVar17),
                                  *(long *)(lVar3 + 0x48 + lVar17));
LAB_0014b36f:
              std::endl<char,std::char_traits<char>>(poVar7);
            }
            else if (uVar10 == uVar14) {
              poVar7 = (ostream *)
                       &alloc.internedIdentifiers._M_t._M_impl.super__Rb_tree_header._M_header.
                        _M_parent;
              std::__ostream_insert<char,std::char_traits<char>>(poVar7,"\t...",4);
              goto LAB_0014b36f;
            }
            uVar14 = uVar14 + 1;
            lVar17 = lVar17 + 0x60;
          } while (uVar9 != uVar14);
        }
        *error = 1;
        pJVar11 = (JsonnetVm *)&files;
        std::__cxx11::stringbuf::str();
        pcVar5 = jsonnet_realloc(pJVar11,(char *)0x0,
                                 files._M_t._M_impl.super__Rb_tree_header._M_header._0_8_ + 1);
        memcpy(pcVar5,(void *)files._M_t._M_impl._0_8_,
               files._M_t._M_impl.super__Rb_tree_header._M_header._0_8_ + 1);
        if ((_Base_ptr *)files._M_t._M_impl._0_8_ !=
            &files._M_t._M_impl.super__Rb_tree_header._M_header._M_parent) {
          operator_delete((void *)files._M_t._M_impl._0_8_,
                          (ulong)((long)&(files._M_t._M_impl.super__Rb_tree_header._M_header.
                                         _M_parent)->_M_color + 1));
        }
      }
      std::__cxx11::stringstream::~stringstream((stringstream *)&alloc);
      std::ios_base::~ios_base(local_138);
      __cxa_end_catch();
      return pcVar5;
    }
    lVar8 = 0;
    for (p_Var4 = files._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
        (_Rb_tree_header *)p_Var4 != p_Var15;
        p_Var4 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var4)) {
      p_Var2 = p_Var4[1]._M_parent;
      memcpy(pcVar5 + lVar8,*(void **)(p_Var4 + 1),(size_t)((long)&p_Var2->_M_color + 1));
      lVar8 = (long)&p_Var2->_M_color + lVar8 + 1;
      p_Var2 = p_Var4[2]._M_parent;
      memcpy(pcVar5 + lVar8,*(void **)(p_Var4 + 2),(size_t)p_Var2);
      (pcVar5 + (long)&p_Var2->_M_color + lVar8)[0] = '\n';
      (pcVar5 + (long)&p_Var2->_M_color + lVar8)[1] = '\0';
      lVar8 = (long)&p_Var2->_M_color + lVar8 + 2;
    }
    pcVar5[lVar8] = '\0';
    *error = 0;
    std::
    _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ::~_Rb_tree(&files._M_t);
  }
  else {
    jsonnet::internal::jsonnet_vm_execute_stream
              ((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)&files,&alloc,expr,ext_vars,uVar16,(double)vm->gcMinObjects,vm->gcGrowthTrigger,
               natives,vm->importCallback,vm->importCallbackContext,vm->stringOutput);
    p_Var15 = (_Rb_tree_header *)files._M_t._M_impl.super__Rb_tree_header._M_header._0_8_;
    puVar13 = (undefined8 *)files._M_t._M_impl._0_8_;
    sVar12 = 1;
    for (lVar8 = files._M_t._M_impl._0_8_;
        lVar8 != files._M_t._M_impl.super__Rb_tree_header._M_header._0_8_; lVar8 = lVar8 + 0x20) {
      sVar12 = sVar12 + *(long *)(lVar8 + 8) + 2;
    }
    pcVar5 = (char *)malloc(sVar12);
    if (pcVar5 == (char *)0x0) goto LAB_0014b103;
    lVar8 = 0;
    for (; (_Rb_tree_header *)puVar13 != p_Var15; puVar13 = puVar13 + 4) {
      sVar12 = puVar13[1];
      memcpy(pcVar5 + lVar8,(void *)*puVar13,sVar12);
      (pcVar5 + sVar12 + lVar8)[0] = '\n';
      (pcVar5 + sVar12 + lVar8)[1] = '\0';
      lVar8 = lVar8 + sVar12 + 2;
    }
    pcVar5[lVar8] = '\0';
    *error = 0;
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)&files);
  }
  std::__cxx11::_List_base<jsonnet::internal::Token,_std::allocator<jsonnet::internal::Token>_>::
  _M_clear(&tokens.
            super__List_base<jsonnet::internal::Token,_std::allocator<jsonnet::internal::Token>_>);
  jsonnet::internal::Allocator::~Allocator(&alloc);
  return pcVar5;
}

Assistant:

static char *jsonnet_evaluate_snippet_aux(JsonnetVm *vm, const char *filename, const char *snippet,
                                          int *error, EvalKind kind)
{
    try {
        Allocator alloc;
        AST *expr;
        Tokens tokens = jsonnet_lex(filename, snippet);

        expr = jsonnet_parse(&alloc, tokens);

        jsonnet_desugar(&alloc, expr, &vm->tla);

        unsigned max_stack = vm->maxStack;

        // For the stdlib desugaring.
        max_stack++;

        // For the TLA desugaring.
        max_stack++;

        jsonnet_static_analysis(expr);
        switch (kind) {
            case REGULAR: {
                std::string json_str = jsonnet_vm_execute(&alloc,
                                                          expr,
                                                          vm->ext,
                                                          max_stack,
                                                          vm->gcMinObjects,
                                                          vm->gcGrowthTrigger,
                                                          vm->nativeCallbacks,
                                                          vm->importCallback,
                                                          vm->importCallbackContext,
                                                          vm->stringOutput);
                json_str += "\n";
                *error = false;
                return from_string(vm, json_str);
            } break;

            case MULTI: {
                std::map<std::string, std::string> files =
                    jsonnet_vm_execute_multi(&alloc,
                                             expr,
                                             vm->ext,
                                             max_stack,
                                             vm->gcMinObjects,
                                             vm->gcGrowthTrigger,
                                             vm->nativeCallbacks,
                                             vm->importCallback,
                                             vm->importCallbackContext,
                                             vm->stringOutput);
                size_t sz = 1;  // final sentinel
                for (const auto &pair : files) {
                    sz += pair.first.length() + 1;   // include sentinel
                    sz += pair.second.length() + 2;  // Add a '\n' as well as sentinel
                }
                char *buf = (char *)::malloc(sz);
                if (buf == nullptr)
                    memory_panic();
                std::ptrdiff_t i = 0;
                for (const auto &pair : files) {
                    memcpy(&buf[i], pair.first.c_str(), pair.first.length() + 1);
                    i += pair.first.length() + 1;
                    memcpy(&buf[i], pair.second.c_str(), pair.second.length());
                    i += pair.second.length();
                    buf[i] = '\n';
                    i++;
                    buf[i] = '\0';
                    i++;
                }
                buf[i] = '\0';  // final sentinel
                *error = false;
                return buf;
            } break;

            case STREAM: {
                std::vector<std::string> documents =
                    jsonnet_vm_execute_stream(&alloc,
                                              expr,
                                              vm->ext,
                                              max_stack,
                                              vm->gcMinObjects,
                                              vm->gcGrowthTrigger,
                                              vm->nativeCallbacks,
                                              vm->importCallback,
                                              vm->importCallbackContext,
                                              vm->stringOutput);
                size_t sz = 1;  // final sentinel
                for (const auto &doc : documents) {
                    sz += doc.length() + 2;  // Add a '\n' as well as sentinel
                }
                char *buf = (char *)::malloc(sz);
                if (buf == nullptr)
                    memory_panic();
                std::ptrdiff_t i = 0;
                for (const auto &doc : documents) {
                    memcpy(&buf[i], doc.c_str(), doc.length());
                    i += doc.length();
                    buf[i] = '\n';
                    i++;
                    buf[i] = '\0';
                    i++;
                }
                buf[i] = '\0';  // final sentinel
                *error = false;
                return buf;
            } break;

            default:
                fputs("INTERNAL ERROR: bad value of 'kind', probably memory corruption.\n", stderr);
                abort();
        }

    } catch (StaticError &e) {
        std::stringstream ss;
        ss << "STATIC ERROR: " << e << std::endl;
        *error = true;
        return from_string(vm, ss.str());

    } catch (RuntimeError &e) {
        std::stringstream ss;
        ss << "RUNTIME ERROR: " << e.msg << std::endl;
        const long max_above = vm->maxTrace / 2;
        const long max_below = vm->maxTrace - max_above;
        const long sz = e.stackTrace.size();
        for (long i = 0; i < sz; ++i) {
            const auto &f = e.stackTrace[i];
            if (vm->maxTrace > 0 && i >= max_above && i < sz - max_below) {
                if (i == max_above)
                    ss << "\t..." << std::endl;
            } else {
                ss << "\t" << f.location << "\t" << f.name << std::endl;
            }
        }
        *error = true;
        return from_string(vm, ss.str());
    }

    return nullptr;  // Quiet, compiler.
}